

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

bool cmFileAPI::ReadRequestVersion
               (Value *version,bool inArray,
               vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *result
               ,string *error)

{
  bool bVar1;
  Value *this;
  Value *minor;
  RequestVersion v;
  Value *major;
  RequestVersion v_1;
  string *error_local;
  vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_> *result_local;
  bool inArray_local;
  Value *version_local;
  
  v_1 = (RequestVersion)error;
  bVar1 = Json::Value::isUInt(version);
  if (bVar1) {
    RequestVersion::RequestVersion((RequestVersion *)&major);
    major._0_4_ = Json::Value::asUInt(version);
    std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::push_back
              (result,(value_type *)&major);
    version_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isObject(version);
    if (bVar1) {
      v = (RequestVersion)Json::Value::operator[](version,"major");
      bVar1 = Json::Value::isNull((Value *)v);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)v_1,"\'version\' object \'major\' member missing")
        ;
        version_local._7_1_ = false;
      }
      else {
        bVar1 = Json::Value::isUInt((Value *)v);
        if (bVar1) {
          RequestVersion::RequestVersion((RequestVersion *)&minor);
          minor._0_4_ = Json::Value::asUInt((Value *)v);
          this = Json::Value::operator[](version,"minor");
          bVar1 = Json::Value::isUInt(this);
          if (bVar1) {
            minor._4_4_ = Json::Value::asUInt(this);
          }
          else {
            bVar1 = Json::Value::isNull(this);
            if (!bVar1) {
              std::__cxx11::string::operator=
                        ((string *)v_1,
                         "\'version\' object \'minor\' member is not a non-negative integer");
              return false;
            }
          }
          std::vector<cmFileAPI::RequestVersion,_std::allocator<cmFileAPI::RequestVersion>_>::
          push_back(result,(value_type *)&minor);
          version_local._7_1_ = true;
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)v_1,
                     "\'version\' object \'major\' member is not a non-negative integer");
          version_local._7_1_ = false;
        }
      }
    }
    else {
      if (inArray) {
        std::__cxx11::string::operator=
                  ((string *)v_1,"\'version\' array entry is not a non-negative integer or object");
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)v_1,
                   "\'version\' member is not a non-negative integer, object, or array");
      }
      version_local._7_1_ = false;
    }
  }
  return version_local._7_1_;
}

Assistant:

bool cmFileAPI::ReadRequestVersion(Json::Value const& version, bool inArray,
                                   std::vector<RequestVersion>& result,
                                   std::string& error)
{
  if (version.isUInt()) {
    RequestVersion v;
    v.Major = version.asUInt();
    result.push_back(v);
    return true;
  }

  if (!version.isObject()) {
    if (inArray) {
      error = "'version' array entry is not a non-negative integer or object";
    } else {
      error =
        "'version' member is not a non-negative integer, object, or array";
    }
    return false;
  }

  Json::Value const& major = version["major"];
  if (major.isNull()) {
    error = "'version' object 'major' member missing";
    return false;
  }
  if (!major.isUInt()) {
    error = "'version' object 'major' member is not a non-negative integer";
    return false;
  }

  RequestVersion v;
  v.Major = major.asUInt();

  Json::Value const& minor = version["minor"];
  if (minor.isUInt()) {
    v.Minor = minor.asUInt();
  } else if (!minor.isNull()) {
    error = "'version' object 'minor' member is not a non-negative integer";
    return false;
  }

  result.push_back(v);

  return true;
}